

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* split_coopmat_pointer
            (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *__return_storage_ptr__,string *expr)

{
  char *pcVar1;
  CompilerError *pCVar2;
  ulong uVar3;
  byte local_a1;
  string local_88 [32];
  int local_68;
  uint32_t counter;
  undefined1 local_58 [8];
  string index_expr;
  string ptr_expr;
  string *expr_local;
  
  std::__cxx11::string::string((string *)(index_expr.field_2._M_local_buf + 8),(string *)expr);
  std::__cxx11::string::string((string *)local_58);
  pcVar1 = (char *)std::__cxx11::string::back();
  if (*pcVar1 != ']') {
    pCVar2 = (CompilerError *)__cxa_allocate_exception(0x10);
    spirv_cross::CompilerError::CompilerError
              (pCVar2,"Access chain for coopmat must be indexed into an array.");
    __cxa_throw(pCVar2,&spirv_cross::CompilerError::typeinfo,
                spirv_cross::CompilerError::~CompilerError);
  }
  std::__cxx11::string::pop_back();
  local_68 = 1;
  while( true ) {
    local_a1 = 0;
    if (local_68 != 0) {
      local_a1 = std::__cxx11::string::empty();
      local_a1 = local_a1 ^ 0xff;
    }
    if ((local_a1 & 1) == 0) break;
    pcVar1 = (char *)std::__cxx11::string::back();
    if (*pcVar1 == ']') {
      local_68 = local_68 + 1;
    }
    else {
      pcVar1 = (char *)std::__cxx11::string::back();
      if (*pcVar1 == '[') {
        local_68 = local_68 + -1;
      }
    }
    std::__cxx11::string::pop_back();
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) != 0) {
    pCVar2 = (CompilerError *)__cxa_allocate_exception(0x10);
    spirv_cross::CompilerError::CompilerError(pCVar2,"Invalid pointer expression for coopmat.");
    __cxa_throw(pCVar2,&spirv_cross::CompilerError::typeinfo,
                spirv_cross::CompilerError::~CompilerError);
  }
  std::__cxx11::string::size();
  std::__cxx11::string::size();
  std::__cxx11::string::size();
  std::__cxx11::string::substr((ulong)local_88,(ulong)expr);
  std::__cxx11::string::operator=((string *)local_58,local_88);
  std::__cxx11::string::~string(local_88);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (__return_storage_ptr__,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&index_expr.field_2 + 8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::string::~string((string *)(index_expr.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

static pair<string, string> split_coopmat_pointer(const string &expr)
{
	auto ptr_expr = expr;
	string index_expr;

	if (ptr_expr.back() != ']')
		SPIRV_CROSS_THROW("Access chain for coopmat must be indexed into an array.");

	// Strip the access chain.
	ptr_expr.pop_back();
	uint32_t counter = 1;
	while (counter && !ptr_expr.empty())
	{
		if (ptr_expr.back() == ']')
			counter++;
		else if (ptr_expr.back() == '[')
			counter--;
		ptr_expr.pop_back();
	}

	if (ptr_expr.empty())
		SPIRV_CROSS_THROW("Invalid pointer expression for coopmat.");

	index_expr = expr.substr(ptr_expr.size() + 1, expr.size() - (ptr_expr.size() + 1) - 1);
	return { std::move(ptr_expr), std::move(index_expr) };
}